

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# embedded_geometry_interface.cpp
# Opt level: O0

void __thiscall
geometrycentral::surface::EmbeddedGeometryInterface::computeEdgeCotanWeights
          (EmbeddedGeometryInterface *this)

{
  Vertex e_00;
  Vertex e_01;
  Vertex e_02;
  Edge e_03;
  bool bVar1;
  Vector3 *pVVar2;
  runtime_error *this_00;
  double *pdVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  double cotValue;
  Vector3 vecL;
  Vector3 vecR;
  Vector3 pA;
  Vector3 pC;
  Vector3 pB;
  Halfedge heFirst;
  Halfedge he;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> __end3;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> __begin3;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> *__range3;
  double cotSum;
  Edge e;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __end2;
  RangeIteratorBase<geometrycentral::surface::EdgeRangeF> __begin2;
  EdgeSet *__range2;
  MeshData<geometrycentral::surface::Edge,_double> *in_stack_fffffffffffffc88;
  SurfaceMesh *in_stack_fffffffffffffc90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc98;
  MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3> *in_stack_fffffffffffffca0;
  ParentMeshT *in_stack_fffffffffffffca8;
  allocator *paVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffcb0;
  ParentMeshT *in_stack_fffffffffffffcb8;
  MeshData<geometrycentral::surface::Edge,_double> *in_stack_fffffffffffffcc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_t in_stack_fffffffffffffcd8;
  int __val;
  Vector3 local_320;
  double local_308;
  Vector3 local_300;
  Vector3 local_2e8;
  undefined1 local_2c9;
  allocator local_291;
  string local_290 [160];
  string local_1f0 [32];
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_1d0;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_1c0;
  Vector3 local_1b0;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_198;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_188;
  Vector3 local_178;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_160;
  Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh> local_150;
  Vector3 local_140;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_128;
  Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh> local_118;
  NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
  local_108 [2];
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> local_d8;
  NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> *local_b0;
  SurfaceMesh *local_a8;
  Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh> local_a0;
  undefined1 local_60 [24];
  undefined1 *local_48;
  
  DependentQuantity::ensureHave((DependentQuantity *)in_stack_fffffffffffffc90);
  MeshData<geometrycentral::surface::Edge,_double>::MeshData
            (in_stack_fffffffffffffcc0,in_stack_fffffffffffffcb8);
  MeshData<geometrycentral::surface::Edge,_double>::operator=
            ((MeshData<geometrycentral::surface::Edge,_double> *)in_stack_fffffffffffffc90,
             in_stack_fffffffffffffc88);
  MeshData<geometrycentral::surface::Edge,_double>::~MeshData
            ((MeshData<geometrycentral::surface::Edge,_double> *)in_stack_fffffffffffffc90);
  SurfaceMesh::edges(in_stack_fffffffffffffc90);
  local_48 = local_60;
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::begin
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffc90);
  RangeSetBase<geometrycentral::surface::EdgeRangeF>::end
            ((RangeSetBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffc90);
  do {
    bVar1 = RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator!=
                      ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffffc90,
                       (RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)
                       in_stack_fffffffffffffc88);
    if (!bVar1) {
      return;
    }
    local_a0 = (Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>)
               RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator*
                         ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)0x2bc54f);
    local_a8 = (SurfaceMesh *)0x0;
    Edge::adjacentInteriorHalfedges((Edge *)in_stack_fffffffffffffca0);
    local_b0 = &local_d8;
    NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>::begin
              ((NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator> *
               )in_stack_fffffffffffffca0);
    NavigationSetBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>::end
              (local_108,local_b0);
    while( true ) {
      bVar1 = NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
              ::operator!=((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
                            *)in_stack_fffffffffffffc90,
                           (NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
                            *)in_stack_fffffffffffffc88);
      if (!bVar1) break;
      local_118 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
                    ::operator*((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
                                 *)0x2bc5e6);
      local_128.mesh = local_118.mesh;
      local_128.ind = local_118.ind;
      in_stack_fffffffffffffcb0 = in_RDI + 0x9c;
      local_150 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffc90);
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffcb0;
      e_00.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffca8;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffca0,e_00);
      local_140.x = pVVar2->x;
      local_140.y = pVVar2->y;
      local_140.z = pVVar2->z;
      local_160 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffc90);
      local_118.mesh = local_160.mesh;
      local_118.ind = local_160.ind;
      local_188 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffc90);
      e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffcb0;
      e_01.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffca8;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffca0,e_01);
      local_178.x = pVVar2->x;
      local_178.y = pVVar2->y;
      local_178.z = pVVar2->z;
      local_198 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffc90);
      __rhs = in_RDI + 0x9c;
      local_118 = local_198;
      local_1c0 = (Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>)
                  Halfedge::vertex((Halfedge *)in_stack_fffffffffffffc90);
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      ind = (size_t)in_stack_fffffffffffffcb0;
      e_02.super_Element<geometrycentral::surface::Vertex,_geometrycentral::surface::SurfaceMesh>.
      mesh = in_stack_fffffffffffffca8;
      pVVar2 = MeshData<geometrycentral::surface::Vertex,_geometrycentral::Vector3>::operator[]
                         (in_stack_fffffffffffffca0,e_02);
      local_1b0.x = pVVar2->x;
      local_1b0.y = pVVar2->y;
      local_1b0.z = pVVar2->z;
      local_1d0 = (Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>
                   )Halfedge::next((Halfedge *)in_stack_fffffffffffffc90);
      bVar1 = Element<geometrycentral::surface::Halfedge,_geometrycentral::surface::SurfaceMesh>::
              operator==(&local_1d0,&local_128);
      __val = (int)(in_stack_fffffffffffffcd8 >> 0x20);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        local_2c9 = 1;
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        paVar4 = &local_291;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_290,
                   "/workspace/llm4binary/github/license_c_cmakelists/nmwsharp[P]nonmanifold-laplacian/deps/geometry-central/src/surface/embedded_geometry_interface.cpp"
                   ,paVar4);
        ::std::operator+((char *)in_stack_fffffffffffffc98,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc90);
        ::std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
        ::std::__cxx11::to_string(__val);
        ::std::operator+(in_RDI,__rhs);
        ::std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
        ::std::operator+(in_stack_fffffffffffffc98,(char *)in_stack_fffffffffffffc90);
        ::std::runtime_error::runtime_error(this_00,local_1f0);
        local_2c9 = 0;
        __cxa_throw(this_00,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
      }
      Vector3::operator-(&local_2e8,&local_140,&local_1b0);
      Vector3::operator-(&local_300,&local_178,&local_1b0);
      in_stack_fffffffffffffc98 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           dot(&local_2e8,&local_300);
      cross(&local_320,&local_2e8,&local_300);
      local_308 = norm((Vector3 *)0x2bcae9);
      local_308 = (double)in_stack_fffffffffffffc98 / local_308;
      local_a8 = (SurfaceMesh *)(local_308 / 2.0 + (double)local_a8);
      NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>::
      operator++((NavigationIteratorBase<geometrycentral::surface::EdgeAdjacentInteriorHalfedgeNavigator>
                  *)in_stack_fffffffffffffc90);
    }
    e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.ind =
         (size_t)in_stack_fffffffffffffcb0;
    e_03.super_Element<geometrycentral::surface::Edge,_geometrycentral::surface::SurfaceMesh>.mesh =
         in_stack_fffffffffffffca8;
    in_stack_fffffffffffffc90 = local_a8;
    in_stack_fffffffffffffcd8 = local_a0.ind;
    pdVar3 = MeshData<geometrycentral::surface::Edge,_double>::operator[]
                       ((MeshData<geometrycentral::surface::Edge,_double> *)
                        in_stack_fffffffffffffca0,e_03);
    *pdVar3 = (double)in_stack_fffffffffffffc90;
    RangeIteratorBase<geometrycentral::surface::EdgeRangeF>::operator++
              ((RangeIteratorBase<geometrycentral::surface::EdgeRangeF> *)in_stack_fffffffffffffc90)
    ;
  } while( true );
}

Assistant:

void EmbeddedGeometryInterface::computeEdgeCotanWeights() {
  vertexPositionsQ.ensureHave();

  edgeCotanWeights = EdgeData<double>(mesh);

  for (Edge e : mesh.edges()) {
    double cotSum = 0.;

    for (Halfedge he : e.adjacentInteriorHalfedges()) {
      // WARNING: Logic duplicated between cached and immediate version
      Halfedge heFirst = he;
      Vector3 pB = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pC = vertexPositions[he.vertex()];
      he = he.next();
      Vector3 pA = vertexPositions[he.vertex()];
      GC_SAFETY_ASSERT(he.next() == heFirst, "faces must be triangular");

      Vector3 vecR = pB - pA;
      Vector3 vecL = pC - pA;

      double cotValue = dot(vecR, vecL) / norm(cross(vecR, vecL));
      cotSum += cotValue / 2;
    }

    edgeCotanWeights[e] = cotSum;
  }
}